

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  char cVar4;
  byte bVar5;
  undefined2 uVar6;
  ImGuiTableColumn *pIVar7;
  ImGuiWindow *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  ImU32 id;
  char *pcVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  short sVar18;
  ulong uVar19;
  int iVar20;
  ImGuiTableColumn *pIVar21;
  ulong uVar22;
  int iVar23;
  ImGuiTableColumn *pIVar24;
  bool bVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  ImGuiContext *g;
  ImRect host_clip_rect;
  float local_a4;
  float local_a0;
  ImRect local_68;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar9 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                  ,0x2145,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  fVar28 = (table->WorkRect).Min.x;
  fVar1 = (table->WorkRect).Min.y;
  fVar30 = (table->WorkRect).Max.x;
  fVar27 = table->CellPaddingX2;
  fVar32 = table->CellSpacingX;
  fVar33 = (pIVar9->Style).FramePadding.x * 3.0;
  table->LeftMostStretchedColumnDisplayOrder = -1;
  table->ColumnsAutoFitWidth = 0.0;
  uVar16 = table->ColumnsCount;
  if ((int)uVar16 < 1) {
    fVar29 = 0.0;
    local_a0 = 0.0;
    local_a4 = 0.0;
    fVar27 = fVar32;
  }
  else {
    local_58 = ZEXT416((uint)(fVar33 * 4.0));
    fVar29 = 0.0;
    uVar22 = 0;
    local_a4 = 0.0;
    local_a0 = 0.0;
    do {
      if ((table->VisibleMaskByDisplayOrder >> (uVar22 & 0x3f) & 1) != 0) {
        pcVar14 = (table->DisplayOrderToIndex).Data + uVar22;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar14) goto LAB_001bd19c;
        cVar4 = *pcVar14;
        pIVar24 = (table->Columns).Data + cVar4;
        if ((table->Columns).DataEnd <= pIVar24) goto LAB_001bd185;
        uVar12 = TableFixColumnFlags(table,pIVar24->FlagsIn);
        uVar16 = (uint)(cVar4 != '\0') * 0x4000 + 0x4000;
        if ((uVar12 & 0xc000) != 0) {
          uVar16 = 0;
        }
        uVar16 = uVar16 | uVar12;
        pIVar24->Flags = uVar16;
        uVar12 = table->Flags;
        if ((uVar12 & 8) != 0) {
          TableFixColumnSortDirection(pIVar24);
          uVar12 = table->Flags;
          uVar16 = pIVar24->Flags;
        }
        uVar6 = pIVar24->ContentWidthRowsFrozen;
        sVar18 = pIVar24->ContentWidthRowsUnfrozen;
        if (pIVar24->ContentWidthRowsUnfrozen < (short)uVar6) {
          sVar18 = uVar6;
        }
        fVar29 = (float)(int)sVar18;
        if ((uVar16 & 0x800) == 0 && (uVar12 & 0x8000) == 0) {
          uVar12 = -(uint)((float)(int)pIVar24->ContentWidthHeadersIdeal <= fVar29);
          fVar29 = (float)((uint)fVar29 & uVar12 |
                          ~uVar12 & (uint)(float)(int)pIVar24->ContentWidthHeadersIdeal);
        }
        fVar29 = fVar29 + fVar27;
        uVar12 = -(uint)(fVar33 <= fVar29);
        fVar31 = (float)(~uVar12 & (uint)fVar33 | (uint)fVar29 & uVar12);
        fVar29 = table->ColumnsAutoFitWidth + fVar31;
        table->ColumnsAutoFitWidth = fVar29;
        if ((uVar16 & 0x14) == 0) {
          if ((uVar16 & 8) == 0) {
            __assert_fail("column->Flags & ImGuiTableColumnFlags_WidthStretch",
                          "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                          ,0x2187,"void ImGui::TableUpdateLayout(ImGuiTable *)");
          }
          fVar31 = pIVar24->WidthStretchWeight;
          if (fVar31 < 0.0) {
            pIVar24->WidthStretchWeight = 1.0;
            fVar31 = 1.0;
          }
          local_a4 = local_a4 + fVar31;
          if (table->LeftMostStretchedColumnDisplayOrder == -1) {
            table->LeftMostStretchedColumnDisplayOrder = pIVar24->DisplayOrder;
          }
        }
        else {
          if ((char)((uVar16 & 0x10) >> 4) == '\0' && pIVar24->AutoFitQueue == '\0') {
            fVar31 = pIVar24->WidthRequest;
          }
          else {
            pIVar24->WidthRequest = fVar31;
            if (('\x01' < pIVar24->AutoFitQueue) && (table->IsInitializing == true)) {
              fVar31 = (float)(~-(uint)((float)local_58._0_4_ <= fVar31) & local_58._0_4_ |
                              -(uint)((float)local_58._0_4_ <= fVar31) & (uint)fVar31);
              pIVar24->WidthRequest = fVar31;
            }
          }
          local_a0 = local_a0 + fVar31;
        }
      }
      uVar22 = uVar22 + 1;
      uVar16 = table->ColumnsCount;
    } while ((long)uVar22 < (long)(int)uVar16);
    fVar27 = table->CellSpacingX;
  }
  fVar31 = (float)(table->ColumnsVisibleCount + -1);
  table->ColumnsAutoFitWidth = fVar32 * 3.0 * fVar31 + fVar29;
  fVar27 = fVar27 * fVar31;
  if ((((table->Flags & 0x40000) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar30 = fVar30 - fVar28;
  }
  else {
    fVar30 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  local_a0 = (fVar30 - fVar27) - local_a0;
  table->ColumnsTotalWidth = fVar27;
  if ((int)uVar16 < 1) {
    bVar25 = true;
  }
  else {
    uVar22 = table->VisibleMaskByDisplayOrder;
    uVar19 = 0;
    iVar20 = 0;
    fVar30 = local_a0;
    do {
      if ((uVar22 >> (uVar19 & 0x3f) & 1) != 0) {
        pcVar14 = (table->DisplayOrderToIndex).Data + uVar19;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar14) goto LAB_001bd19c;
        pIVar24 = (table->Columns).Data;
        pIVar7 = (table->Columns).DataEnd;
        pIVar21 = pIVar24 + *pcVar14;
        if (pIVar7 <= pIVar21) goto LAB_001bd185;
        uVar12 = pIVar21->Flags;
        if ((uVar12 & 8) == 0) {
          if (pIVar21->NextVisibleColumn == -1) {
LAB_001bcbdb:
            if (table->LeftMostStretchedColumnDisplayOrder != -1) {
              uVar12 = uVar12 | 0x100000;
              goto LAB_001bcbeb;
            }
          }
        }
        else {
          fVar32 = (pIVar21->WidthStretchWeight / local_a4) * local_a0;
          uVar26 = -(uint)(fVar33 <= fVar32);
          fVar32 = (float)(int)((float)(~uVar26 & (uint)fVar33 | (uint)fVar32 & uVar26) + 0.01);
          pIVar21->WidthRequest = fVar32;
          fVar30 = fVar30 - fVar32;
          if ((long)pIVar21->NextVisibleColumn == -1) goto LAB_001bcbdb;
          pIVar24 = pIVar24 + pIVar21->NextVisibleColumn;
          if (pIVar7 <= pIVar24) goto LAB_001bd185;
          uVar26 = pIVar24->Flags;
          if ((uVar26 & 4) == 0) goto LAB_001bcbef;
          uVar12 = uVar12 | uVar26 & 0x100000;
LAB_001bcbeb:
          pIVar21->Flags = uVar12;
        }
LAB_001bcbef:
        iVar20 = iVar20 + (uint)((uVar12 & 0x20) == 0);
        uVar12 = -(uint)(fVar33 <= pIVar21->WidthRequest);
        fVar32 = (float)(int)(float)(~uVar12 & (uint)fVar33 | (uint)pIVar21->WidthRequest & uVar12);
        pIVar21->WidthGiven = fVar32;
        fVar27 = fVar27 + fVar32;
        table->ColumnsTotalWidth = fVar27;
      }
      uVar19 = uVar19 + 1;
    } while (uVar16 != uVar19);
    bVar25 = iVar20 == 0;
    local_a0 = fVar30;
  }
  if (((1.0 <= local_a0) && (0 < (int)uVar16)) && (0.0 < local_a4)) {
    uVar22 = table->VisibleMaskByDisplayOrder;
    uVar19 = (ulong)uVar16;
    do {
      uVar17 = uVar19 - 1;
      if ((uVar22 >> (uVar17 & 0x3f) & 1) != 0) {
        pcVar14 = (table->DisplayOrderToIndex).Data + uVar17;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar14) goto LAB_001bd19c;
        pIVar24 = (table->Columns).Data + *pcVar14;
        if ((table->Columns).DataEnd <= pIVar24) goto LAB_001bd185;
        if ((pIVar24->Flags & 8) != 0) {
          uVar2 = pIVar24->WidthRequest;
          uVar3 = pIVar24->WidthGiven;
          pIVar24->WidthRequest = (float)uVar2 + 1.0;
          pIVar24->WidthGiven = (float)uVar3 + 1.0;
          local_a0 = local_a0 + -1.0;
        }
      }
    } while ((1.0 <= local_a0) && (bVar10 = 1 < uVar19, uVar19 = uVar17, bVar10));
  }
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar30 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar27 = local_40.Min.y + table->LastOuterHeight;
  uVar16 = -(uint)(fVar27 <= fVar30);
  local_40.Max.y = (float)(uVar16 & (uint)fVar30 | ~uVar16 & (uint)fVar27);
  bVar10 = ItemHoverable(&local_40,0);
  fVar30 = fVar28;
  if ('\0' < table->FreezeColumnsCount) {
    fVar30 = (table->OuterRect).Min.x;
  }
  local_68.Min = (table->InnerClipRect).Min;
  local_68.Max = (table->InnerClipRect).Max;
  uVar22 = (ulong)(uint)table->ColumnsCount;
  if (0 < table->ColumnsCount) {
    iVar23 = 0;
    uVar19 = 0;
    iVar20 = 0;
    do {
      pbVar15 = (byte *)((table->DisplayOrderToIndex).Data + uVar19);
      if ((table->DisplayOrderToIndex).DataEnd <= pbVar15) goto LAB_001bd19c;
      bVar5 = *pbVar15;
      pIVar24 = (table->Columns).Data + (char)bVar5;
      if ((table->Columns).DataEnd <= pIVar24) goto LAB_001bd185;
      if (iVar20 == table->FreezeColumnsCount && '\0' < table->FreezeColumnsCount) {
        fVar30 = fVar30 + (fVar28 - (table->OuterRect).Min.x);
      }
      if ((table->VisibleMaskByDisplayOrder >> (uVar19 & 0x3f) & 1) == 0) {
        pIVar24->MaxX = fVar30;
        pIVar24->MinX = fVar30;
        pIVar24->StartXHeaders = fVar30;
        pIVar24->StartXRows = fVar30;
        pIVar24->WidthGiven = 0.0;
        (pIVar24->ClipRect).Min.x = fVar30;
        (pIVar24->ClipRect).Min.y = fVar1;
        (pIVar24->ClipRect).Max.x = fVar30;
        (pIVar24->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar24->ClipRect,&local_68);
        pIVar24->IsClipped = true;
        pIVar24->SkipItems = true;
      }
      else {
        if (((uint)table->Flags >> 0x12 & 1) == 0) {
          fVar27 = 3.4028235e+38;
          if (((uint)table->Flags >> 0x11 & 1) == 0) {
            iVar13 = ~(int)pIVar24->IndexWithinVisibleSet + table->ColumnsVisibleCount;
            fVar27 = (table->WorkRect).Max.x;
LAB_001bce9f:
            fVar27 = fVar27 - (float)iVar13 * fVar33;
          }
        }
        else {
          fVar27 = 3.4028235e+38;
          if ((long)uVar19 < (long)table->FreezeColumnsRequest) {
            iVar13 = table->FreezeColumnsRequest + iVar23;
            fVar27 = (table->InnerClipRect).Max.x;
            goto LAB_001bce9f;
          }
        }
        fVar32 = pIVar24->WidthGiven + fVar30;
        if (fVar27 < fVar32) {
          uVar16 = -(uint)(fVar33 <= fVar27 - fVar30);
          fVar32 = (float)(~uVar16 & (uint)fVar33 | (uint)(fVar27 - fVar30) & uVar16);
          pIVar24->WidthGiven = fVar32;
          fVar32 = fVar32 + fVar30;
        }
        pIVar24->MinX = fVar30;
        pIVar24->MaxX = fVar32;
        (pIVar24->ClipRect).Min.x = fVar30;
        (pIVar24->ClipRect).Min.y = fVar1;
        (pIVar24->ClipRect).Max.x = fVar32;
        (pIVar24->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar24->ClipRect,&local_68);
        fVar27 = (pIVar24->ClipRect).Min.x;
        if ((fVar27 < (pIVar24->ClipRect).Max.x) || ((pIVar24->AutoFitQueue & 1U) != 0)) {
          pIVar24->IsClipped = false;
        }
        else {
          pIVar24->IsClipped = (bool)(~pIVar24->CannotSkipItemsQueue & 1);
          if ((pIVar24->CannotSkipItemsQueue & 1U) == 0) {
            table->VisibleUnclippedMaskByIndex =
                 table->VisibleUnclippedMaskByIndex &
                 (-2L << (bVar5 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar5 & 0x3f));
          }
        }
        bVar11 = true;
        if (pIVar24->IsVisible == true) {
          bVar11 = table->HostSkipItems;
        }
        pIVar24->SkipItems = bVar11;
        if (((bVar10) && (fVar32 = (pIVar9->IO).MousePos.x, fVar27 <= fVar32)) &&
           (fVar32 < (pIVar24->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar5;
        }
        fVar27 = pIVar24->MinX + table->CellPaddingX1;
        pIVar24->StartXRows = fVar27;
        pIVar24->StartXHeaders = fVar27;
        pIVar24->ContentMaxPosRowsFrozen = fVar27;
        pIVar24->ContentMaxPosRowsUnfrozen = fVar27;
        pIVar24->ContentMaxPosHeadersIdeal = fVar27;
        pIVar24->ContentMaxPosHeadersUsed = fVar27;
        if (table->HostSkipItems == false) {
          pIVar24->AutoFitQueue = pIVar24->AutoFitQueue >> 1;
          pIVar24->CannotSkipItemsQueue = pIVar24->CannotSkipItemsQueue >> 1;
        }
        if (iVar20 < table->FreezeColumnsCount) {
          fVar27 = pIVar24->MaxX + 2.0;
          uVar16 = -(uint)(fVar27 <= local_68.Min.x);
          local_68.Min.x = (float)(~uVar16 & (uint)fVar27 | (uint)local_68.Min.x & uVar16);
        }
        fVar30 = fVar30 + pIVar24->WidthGiven + table->CellSpacingX;
        iVar20 = iVar20 + 1;
      }
      uVar19 = uVar19 + 1;
      uVar22 = (ulong)table->ColumnsCount;
      iVar23 = iVar23 + -1;
    } while ((long)uVar19 < (long)uVar22);
  }
  if ((bVar10) && (table->HoveredColumnBody == -1)) {
    fVar28 = (table->WorkRect).Min.x;
    if ((long)table->RightMostVisibleColumn != -1) {
      pIVar24 = (table->Columns).Data + table->RightMostVisibleColumn;
      if ((table->Columns).DataEnd <= pIVar24) {
LAB_001bd185:
        pcVar14 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
        goto LAB_001bd1b1;
      }
      fVar1 = (pIVar24->ClipRect).Max.x;
      uVar16 = -(uint)(fVar1 <= fVar28);
      fVar28 = (float)((uint)fVar28 & uVar16 | ~uVar16 & (uint)fVar1);
    }
    if (fVar28 <= (pIVar9->IO).MousePos.x) {
      table->HoveredColumnBody = (ImS8)uVar22;
    }
  }
  if ((bVar25) && ((table->Flags & 1U) != 0)) {
    table->Flags = table->Flags & 0xfffffffe;
  }
  TableUpdateDrawChannels(table);
  if ((table->Flags & 1) != 0) {
    TableUpdateBorders(table);
  }
  table->LastFirstRowHeight = 0.0;
  table->IsLayoutLocked = true;
  table->IsUsingHeaders = false;
  if ((table->IsContextPopupOpen == true) && (table->InstanceCurrent == table->InstanceInteracted))
  {
    id = ImHashStr("##ContextMenu",0,table->ID);
    bVar25 = BeginPopupEx(id,0x141);
    if (bVar25) {
      TableDrawContextMenu(table);
      EndPopup();
    }
    else {
      table->IsContextPopupOpen = false;
    }
  }
  pIVar8 = table->InnerWindow;
  if ((table->Flags & 0x1000) == 0) {
    ImDrawList::PushClipRect(pIVar8->DrawList,(pIVar8->ClipRect).Min,(pIVar8->ClipRect).Max,false);
  }
  else {
    ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar8->DrawList,1);
  }
  if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
    TableSortSpecsBuild(table);
  }
  return;
LAB_001bd19c:
  pcVar14 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
LAB_001bd1b1:
  __assert_fail("p < DataEnd",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_internal.h"
                ,0x20a,pcVar14);
}

Assistant:

void    ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;

    // Compute offset, clip rect for the frame
    // (can't make auto padding larger than what WorkRect knows about so right-alignment matches)
    const ImRect work_rect = table->WorkRect;
    const float padding_auto_x = table->CellPaddingX2;
    const float spacing_auto_x = table->CellSpacingX * (1.0f + 2.0f); // CellSpacingX is >0.0f when there's no vertical border, in which case we add two extra CellSpacingX to make auto-fit look nice instead of cramped. We may want to expose this somehow.
    const float min_column_width = TableGetMinColumnWidth();

    int count_fixed = 0;
    float sum_weights_stretched = 0.0f;     // Sum of all weights for weighted columns.
    float sum_width_fixed_requests = 0.0f;  // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns.
    table->LeftMostStretchedColumnDisplayOrder = -1;
    table->ColumnsAutoFitWidth = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Adjust flags: default width mode + weighted columns are not allowed when auto extending
        // FIXME-TABLE: Clarify why we need to do this again here and not just in TableSetupColumn()
        column->Flags = TableFixColumnFlags(table, column->FlagsIn);
        if ((column->Flags & ImGuiTableColumnFlags_IndentMask_) == 0)
            column->Flags |= (column_n == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

        // We have a unusual edge case where if the user doesn't call TableGetSortSpecs() but has sorting enabled
        // or varying sorting flags, we still want the sorting arrows to honor those flags.
        if (table->Flags & ImGuiTableFlags_Sortable)
            TableFixColumnSortDirection(column);

        // Calculate "ideal" column width for nothing to be clipped.
        // Combine width from regular rows + width from headers unless requested not to.
        const float column_content_width_rows = (float)ImMax(column->ContentWidthRowsFrozen, column->ContentWidthRowsUnfrozen);
        const float column_content_width_headers = (float)column->ContentWidthHeadersIdeal;
        float column_width_ideal = column_content_width_rows;
        if (!(table->Flags & ImGuiTableFlags_NoHeadersWidth) && !(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
            column_width_ideal = ImMax(column_width_ideal, column_content_width_headers);
        column_width_ideal = ImMax(column_width_ideal + padding_auto_x, min_column_width);
        table->ColumnsAutoFitWidth += column_width_ideal;

        if (column->Flags & (ImGuiTableColumnFlags_WidthAlwaysAutoResize | ImGuiTableColumnFlags_WidthFixed))
        {
            // Latch initial size for fixed columns
            count_fixed += 1;
            const bool auto_fit = (column->AutoFitQueue != 0x00) || (column->Flags & ImGuiTableColumnFlags_WidthAlwaysAutoResize);
            if (auto_fit)
            {
                column->WidthRequest = column_width_ideal;

                // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
                // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
                // large height (= first frame scrollbar display very off + clipper would skip lots of items).
                // This is merely making the side-effect less extreme, but doesn't properly fixes it.
                // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
                if (column->AutoFitQueue > 0x01 && table->IsInitializing)
                    column->WidthRequest = ImMax(column->WidthRequest, min_column_width * 4.0f);
            }
            sum_width_fixed_requests += column->WidthRequest;
        }
        else
        {
            IM_ASSERT(column->Flags & ImGuiTableColumnFlags_WidthStretch);
            const int init_size = (column->WidthStretchWeight < 0.0f);
            if (init_size)
                column->WidthStretchWeight = 1.0f;
            sum_weights_stretched += column->WidthStretchWeight;
            if (table->LeftMostStretchedColumnDisplayOrder == -1)
                table->LeftMostStretchedColumnDisplayOrder = (ImS8)column->DisplayOrder;
        }
    }

    // CellSpacingX is >0.0f when there's no vertical border, in which case we add two extra CellSpacingX to make auto-fit look nice instead of cramped.
    // We may want to expose this somehow.
    table->ColumnsAutoFitWidth += spacing_auto_x * (table->ColumnsVisibleCount - 1);

    // Layout
    const float width_spacings = table->CellSpacingX * (table->ColumnsVisibleCount - 1);
    float width_avail;
    if ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f)
        width_avail = table->InnerClipRect.GetWidth() - width_spacings;
    else
        width_avail = work_rect.GetWidth() - width_spacings;
    const float width_avail_for_stretched_columns = width_avail - sum_width_fixed_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;

    // Apply final width based on requested widths
    // Mark some columns as not resizable
    int count_resizable = 0;
    table->ColumnsTotalWidth = width_spacings;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];

        // Allocate width for stretched/weighted columns
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            // WidthStretchWeight gets converted into WidthRequest
            float weight_ratio = column->WidthStretchWeight / sum_weights_stretched;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, min_column_width) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;

            // [Resize Rule 2] Resizing from right-side of a weighted column preceding a fixed column
            // needs to forward resizing to left-side of fixed column. We also need to copy the NoResize flag..
            if (column->NextVisibleColumn != -1)
                if (ImGuiTableColumn* next_column = &table->Columns[column->NextVisibleColumn])
                    if (next_column->Flags & ImGuiTableColumnFlags_WidthFixed)
                        column->Flags |= (next_column->Flags & ImGuiTableColumnFlags_NoDirectResize_);
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // (see comments in TableResizeColumn())
        if (column->NextVisibleColumn == -1 && table->LeftMostStretchedColumnDisplayOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        if (!(column->Flags & ImGuiTableColumnFlags_NoResize))
            count_resizable++;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, min_column_width));
        table->ColumnsTotalWidth += column->WidthGiven;
    }

#if 0
    const float width_excess = table->ColumnsTotalWidth - work_rect.GetWidth();
    if ((table->Flags & ImGuiTableFlags_SizingPolicyStretchX) && width_excess > 0.0f)
    {
        // Shrink widths when the total does not fit
        // FIXME-TABLE: This is working but confuses/conflicts with manual resizing.
        // FIXME-TABLE: Policy to shrink down below below ideal/requested width if there's no room?
        g.ShrinkWidthBuffer.resize(table->ColumnsVisibleCount);
        for (int order_n = 0, visible_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            const int column_n = table->DisplayOrder[order_n];
            g.ShrinkWidthBuffer[visible_n].Index = column_n;
            g.ShrinkWidthBuffer[visible_n].Width = table->Columns[column_n].WidthGiven;
            visible_n++;
        }
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int n = 0; n < g.ShrinkWidthBuffer.Size; n++)
            table->Columns[g.ShrinkWidthBuffer.Data[n].Index].WidthGiven = ImMax(g.ShrinkWidthBuffer.Data[n].Width, min_column_size);
        // FIXME: Need to alter table->ColumnsTotalWidth
    }
    else
#endif

    // Redistribute remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor), could be adjusted depending
    // on where the mouse cursor is and/or relative weights.
    // FIXME-TABLE: May be simpler to store floating width and floor final positions only
    // FIXME-TABLE: Make it optional? User might prefer to preserve pixel perfect same size?
    if (width_remaining_for_stretched_columns >= 1.0f)
        for (int order_n = table->ColumnsCount - 1; sum_weights_stretched > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Detect hovered column
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // Setup final position, offset and clipping rectangles
    int visible_n = 0;
    float offset_x = (table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x;
    ImRect host_clip_rect = table->InnerClipRect;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        if (table->FreezeColumnsCount > 0 && table->FreezeColumnsCount == visible_n)
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;

        if ((table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = offset_x;
            column->StartXRows = column->StartXHeaders = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.x = offset_x;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.x = offset_x;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsClipped = column->SkipItems = true;
            continue;
        }

        float max_x = FLT_MAX;
        if (table->Flags & ImGuiTableFlags_ScrollX)
        {
            // Frozen columns can't reach beyond visible width else scrolling will naturally break.
            if (order_n < table->FreezeColumnsRequest)
                max_x = table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - order_n) * min_column_width;
        }
        else
        {
            // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
            // sure they are all visible. Because of this we also know that all of the columns will always fit in
            // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
            if (!(table->Flags & ImGuiTableFlags_NoKeepColumnsVisible))
                max_x = table->WorkRect.Max.x - (table->ColumnsVisibleCount - (column->IndexWithinVisibleSet + 1)) * min_column_width;
        }
        if (offset_x + column->WidthGiven > max_x)
            column->WidthGiven = ImMax(max_x - offset_x, min_column_width);

        column->MinX = offset_x;
        column->MaxX = column->MinX + column->WidthGiven;

        //// A one pixel padding on the right side makes clipping more noticeable and contents look less cramped.
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX;// -1.0f;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        column->IsClipped = (column->ClipRect.Max.x <= column->ClipRect.Min.x) && (column->AutoFitQueue & 1) == 0 && (column->CannotSkipItemsQueue & 1) == 0;
        if (column->IsClipped)
            table->VisibleUnclippedMaskByIndex &= ~((ImU64)1 << column_n);  // Columns with the _WidthAlwaysAutoResize sizing policy will never be updated then.

        column->SkipItems = !column->IsVisible || table->HostSkipItems;

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImS8)column_n;

        // Starting cursor position
        column->StartXRows = column->StartXHeaders = column->MinX + table->CellPaddingX1;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->StartXRows = ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->StartXRows = ImLerp(column->StartXRows, ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        const float initial_max_pos_x = column->MinX + table->CellPaddingX1;
        column->ContentMaxPosRowsFrozen = column->ContentMaxPosRowsUnfrozen = initial_max_pos_x;
        column->ContentMaxPosHeadersUsed = column->ContentMaxPosHeadersIdeal = initial_max_pos_x;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImMax(host_clip_rect.Min.x, column->MaxX + 2.0f);

        offset_x += column->WidthGiven + table->CellSpacingX;
        visible_n++;
    }

    // Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        float unused_x1 = table->WorkRect.Min.x;
        if (table->RightMostVisibleColumn != -1)
            unused_x1 = ImMax(unused_x1, table->Columns[table->RightMostVisibleColumn].ClipRect.Max.x);
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImS8)table->ColumnsCount;
    }

    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag,
    // either because of using _WidthAlwaysAutoResize/_WidthStretch).
    // This will hide the resizing option from the context menu.
    if (count_resizable == 0 && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // Allocate draw channels
    TableUpdateDrawChannels(table);

    // Borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);

    // Reset fields after we used them in TableSetupResize()
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClipX)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 1);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);

    // Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);
}